

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O2

uint16_t LCDReadData(void)

{
  uint8_t uVar1;
  uint8_t uVar2;
  
  LCDWaitForReady();
  bcm2835_gpio_write('\b','\0');
  bcm2835_spi_transfer('\x10');
  bcm2835_spi_transfer('\0');
  LCDWaitForReady();
  bcm2835_spi_transfer('\0');
  bcm2835_spi_transfer('\0');
  LCDWaitForReady();
  uVar1 = bcm2835_spi_transfer('\0');
  uVar2 = bcm2835_spi_transfer('\0');
  bcm2835_gpio_write('\b','\x01');
  return CONCAT11(uVar1,uVar2);
}

Assistant:

uint16_t LCDReadData()
{
	uint16_t wRData; 
	
	uint16_t wPreamble = 0x1000;

	LCDWaitForReady();

	bcm2835_gpio_write(CS,LOW);
		
	bcm2835_spi_transfer(wPreamble>>8);
	bcm2835_spi_transfer(wPreamble);

	LCDWaitForReady();
	
	wRData=bcm2835_spi_transfer(0x00);//dummy
	wRData=bcm2835_spi_transfer(0x00);//dummy
	
	LCDWaitForReady();
	
	wRData = bcm2835_spi_transfer(0x00)<<8;
	wRData |= bcm2835_spi_transfer(0x00);
		
	bcm2835_gpio_write(CS,HIGH); 
		
	return wRData;
}